

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

ipv4_endpoint __thiscall server_socket::local_endpoint(server_socket *this)

{
  int iVar1;
  int *piVar2;
  socklen_t local_2c;
  int res;
  socklen_t saddr_len;
  sockaddr_in saddr;
  server_socket *this_local;
  
  saddr.sin_zero = (uchar  [8])this;
  memset(&res,0,0x10);
  local_2c = 0x10;
  iVar1 = weak_file_descriptor::getfd((weak_file_descriptor *)this);
  iVar1 = getsockname(iVar1,(sockaddr *)&res,&local_2c);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    throw_error(*piVar2,"getsockname()");
  }
  if (local_2c == 0x10) {
    ipv4_endpoint::ipv4_endpoint((ipv4_endpoint *)&this_local,res._2_2_,saddr_len);
    return (ipv4_endpoint)this_local;
  }
  __assert_fail("saddr_len == sizeof saddr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/socket.cpp"
                ,0xe0,"ipv4_endpoint server_socket::local_endpoint() const");
}

Assistant:

ipv4_endpoint server_socket::local_endpoint() const
{
    sockaddr_in saddr{};
    socklen_t saddr_len = sizeof saddr;
    int res = ::getsockname(fd.getfd(), reinterpret_cast<sockaddr*>(&saddr), &saddr_len);
    if (res == -1)
        throw_error(errno, "getsockname()");
    assert(saddr_len == sizeof saddr);
    return ipv4_endpoint{saddr.sin_port, saddr.sin_addr.s_addr};
}